

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void sel2_symbol(t_sel2 *x,t_symbol *s)

{
  int local_24;
  t_selectelement *ptStack_20;
  int nelement;
  t_selectelement *e;
  t_symbol *s_local;
  t_sel2 *x_local;
  
  if (x->x_type == A_SYMBOL) {
    ptStack_20 = x->x_vec;
    local_24 = (int)x->x_nelement;
    while (local_24 != 0) {
      if ((ptStack_20->e_w).w_symbol == s) {
        outlet_bang(ptStack_20->e_outlet);
        return;
      }
      ptStack_20 = ptStack_20 + 1;
      local_24 = local_24 + -1;
    }
  }
  outlet_symbol(x->x_rejectout,s);
  return;
}

Assistant:

static void sel2_symbol(t_sel2 *x, t_symbol *s)
{
    t_selectelement *e;
    int nelement;
    if (x->x_type == A_SYMBOL)
    {
        for (nelement = (int)x->x_nelement, e = x->x_vec; nelement--; e++)
            if (e->e_w.w_symbol == s)
        {
            outlet_bang(e->e_outlet);
            return;
        }
    }
    outlet_symbol(x->x_rejectout, s);
}